

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

ON_UuidIndexList2 * __thiscall
ON_UuidIndexList2::operator=(ON_UuidIndexList2 *this,ON_UuidIndexList2 *src)

{
  _Head_base<0UL,_ON_UuidIndexList2_Private_*,_false> __ht;
  size_t sVar1;
  _Hashtable<ON_UUID_struct,std::pair<ON_UUID_struct_const,int>,std::allocator<std::pair<ON_UUID_struct_const,int>>,std::__detail::_Select1st,std::equal_to<ON_UUID_struct>,ON_UuidList2_Private<int>::UuidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *this_00;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_ON_UUID_struct,_int>,_true>_>_>
  local_20;
  
  if (this != src) {
    this_00 = (_Hashtable<ON_UUID_struct,std::pair<ON_UUID_struct_const,int>,std::allocator<std::pair<ON_UUID_struct_const,int>>,std::__detail::_Select1st,std::equal_to<ON_UUID_struct>,ON_UuidList2_Private<int>::UuidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)operator_new(0x38);
    __ht._M_head_impl =
         (src->m_private)._M_t.
         super___uniq_ptr_impl<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
         ._M_t.
         super__Tuple_impl<0UL,_ON_UuidIndexList2_Private_*,_std::default_delete<ON_UuidIndexList2_Private>_>
         .super__Head_base<0UL,_ON_UuidIndexList2_Private_*,_false>._M_head_impl;
    *(undefined8 *)this_00 = 0;
    *(size_type *)(this_00 + 8) =
         *(size_type *)((long)&(__ht._M_head_impl)->super_ON_UuidList2_Private<int> + 8);
    *(undefined8 *)(this_00 + 0x10) = 0;
    *(size_type *)(this_00 + 0x18) =
         *(size_type *)((long)&(__ht._M_head_impl)->super_ON_UuidList2_Private<int> + 0x18);
    sVar1 = *(size_t *)((long)&(__ht._M_head_impl)->super_ON_UuidList2_Private<int> + 0x28);
    *(undefined8 *)(this_00 + 0x20) =
         *(undefined8 *)((long)&(__ht._M_head_impl)->super_ON_UuidList2_Private<int> + 0x20);
    *(size_t *)(this_00 + 0x28) = sVar1;
    *(undefined8 *)(this_00 + 0x30) = 0;
    local_20._M_h = (__hashtable_alloc *)this_00;
    std::
    _Hashtable<ON_UUID_struct,std::pair<ON_UUID_struct_const,int>,std::allocator<std::pair<ON_UUID_struct_const,int>>,std::__detail::_Select1st,std::equal_to<ON_UUID_struct>,ON_UuidList2_Private<int>::UuidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<ON_UUID_struct,std::pair<ON_UUID_struct_const,int>,std::allocator<std::pair<ON_UUID_struct_const,int>>,std::__detail::_Select1st,std::equal_to<ON_UUID_struct>,ON_UuidList2_Private<int>::UuidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<ON_UUID_struct_const,int>,true>>>>
              (this_00,(_Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_int>,_std::allocator<std::pair<const_ON_UUID_struct,_int>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<int>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)__ht._M_head_impl,&local_20);
    std::__uniq_ptr_impl<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
    ::reset((__uniq_ptr_impl<ON_UuidIndexList2_Private,_std::default_delete<ON_UuidIndexList2_Private>_>
             *)this,(pointer)this_00);
  }
  return this;
}

Assistant:

ON_UuidIndexList2& ON_UuidIndexList2::operator=(const ON_UuidIndexList2& src)
{
  if (this != &src)
  {
    m_private.reset(new ON_UuidIndexList2_Private(*src.m_private));
  }
  return *this;
}